

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O1

Read<double> __thiscall
Omega_h::graph_reduce<double>(Omega_h *this,Graph *a2b,Read<double> *b_data,Int width,Omega_h_Op op)

{
  int *piVar1;
  Alloc *pAVar2;
  void *pvVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  Read<signed_char> RVar4;
  Read<double> RVar5;
  LOs a2ab;
  LOs ab2b;
  Read<double> ab_data;
  Alloc *local_a0;
  LOs local_90;
  LOs local_80;
  Alloc *local_70;
  void *local_68;
  Read<signed_char> local_60;
  Read<signed_char> local_50;
  Alloc *local_40;
  void *local_38;
  Write<signed_char> local_30;
  
  local_a0 = (a2b->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0 = (Alloc *)(local_a0->size * 8 + 1);
    }
    else {
      local_a0->use_count = local_a0->use_count + 1;
    }
  }
  pvVar3 = (a2b->a2ab).write_.shared_alloc_.direct_ptr;
  local_70 = (a2b->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70 = (Alloc *)(local_70->size * 8 + 1);
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  local_80.write_.shared_alloc_.direct_ptr = (a2b->ab2b).write_.shared_alloc_.direct_ptr;
  local_80.write_.shared_alloc_.alloc = local_70;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.write_.shared_alloc_.alloc = (Alloc *)(local_70->size * 8 + 1);
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  local_50.write_.shared_alloc_.alloc = (b_data->write_).shared_alloc_.alloc;
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50.write_.shared_alloc_.alloc =
           (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_50.write_.shared_alloc_.alloc)->use_count =
           (local_50.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_50.write_.shared_alloc_.direct_ptr = (b_data->write_).shared_alloc_.direct_ptr;
  local_68 = local_80.write_.shared_alloc_.direct_ptr;
  unmap<double>((Omega_h *)&local_30,&local_80,&local_50,width);
  read<double>((Omega_h *)&local_40,&local_30);
  if (((ulong)local_30.shared_alloc_.alloc & 7) == 0 && local_30.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_30.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_30.shared_alloc_.alloc);
      operator_delete(local_30.shared_alloc_.alloc,0x48);
    }
  }
  pAVar2 = local_50.write_.shared_alloc_.alloc;
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_80.write_.shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_90.write_.shared_alloc_.alloc = local_a0;
  if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc = (Alloc *)(local_a0->size * 8 + 1);
    }
    else {
      local_a0->use_count = local_a0->use_count + 1;
    }
  }
  local_60.write_.shared_alloc_.alloc = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  local_60.write_.shared_alloc_.direct_ptr = local_38;
  local_90.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4 = fan_reduce<double>(this,&local_90,&local_60,width,op);
  pAVar2 = local_60.write_.shared_alloc_.alloc;
  pvVar3 = RVar4.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX;
    }
  }
  pAVar2 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_00;
    }
  }
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    piVar1 = &local_40->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40);
      operator_delete(local_40,0x48);
      pvVar3 = extraout_RDX_01;
    }
  }
  pAVar2 = local_70;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    piVar1 = &local_70->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_02;
    }
  }
  if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
    piVar1 = &local_a0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a0);
      operator_delete(local_a0,0x48);
      pvVar3 = extraout_RDX_03;
    }
  }
  RVar5.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar5.write_.shared_alloc_;
}

Assistant:

Read<T> graph_reduce(Graph a2b, Read<T> b_data, Int width, Omega_h_Op op) {
  auto a2ab = a2b.a2ab;
  auto ab2b = a2b.ab2b;
  auto ab_data = read(unmap(ab2b, b_data, width));
  return fan_reduce(a2ab, ab_data, width, op);
}